

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::ExpressionResultBuilder::ExpressionResultBuilder
          (ExpressionResultBuilder *this,ExpressionResultBuilder *other)

{
  pointer pcVar1;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  (this->m_data).reconstructedExpression._M_dataplus._M_p =
       (pointer)&(this->m_data).reconstructedExpression.field_2;
  pcVar1 = (other->m_data).reconstructedExpression._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (other->m_data).reconstructedExpression._M_string_length
            );
  (this->m_data).message._M_dataplus._M_p = (pointer)&(this->m_data).message.field_2;
  pcVar1 = (other->m_data).message._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_data).message,pcVar1,
             pcVar1 + (other->m_data).message._M_string_length);
  (this->m_data).resultType = (other->m_data).resultType;
  (this->m_exprComponents).shouldNegate = (other->m_exprComponents).shouldNegate;
  (this->m_exprComponents).lhs._M_dataplus._M_p = (pointer)&(this->m_exprComponents).lhs.field_2;
  pcVar1 = (other->m_exprComponents).lhs._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_exprComponents).lhs,pcVar1,
             pcVar1 + (other->m_exprComponents).lhs._M_string_length);
  (this->m_exprComponents).rhs._M_dataplus._M_p = (pointer)&(this->m_exprComponents).rhs.field_2;
  pcVar1 = (other->m_exprComponents).rhs._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_exprComponents).rhs,pcVar1,
             pcVar1 + (other->m_exprComponents).rhs._M_string_length);
  (this->m_exprComponents).op._M_dataplus._M_p = (pointer)&(this->m_exprComponents).op.field_2;
  pcVar1 = (other->m_exprComponents).op._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_exprComponents).op,pcVar1,
             pcVar1 + (other->m_exprComponents).op._M_string_length);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_stream);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->m_stream,local_50,local_48);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return;
}

Assistant:

ExpressionResultBuilder::ExpressionResultBuilder( ExpressionResultBuilder const& other )
    :   m_data( other.m_data ),
        m_exprComponents( other.m_exprComponents )
    {
        m_stream << other.m_stream.str();
    }